

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::ContinuousAssignSymbol::getAssignment(ContinuousAssignSymbol *this)

{
  Scope *scope;
  SyntaxNode *this_00;
  int iVar1;
  ExpressionSyntax *pEVar2;
  undefined4 extraout_var;
  LookupLocation LVar4;
  LookupLocation lookupLocation;
  ASTContext context;
  Expression *pEVar3;
  
  pEVar3 = this->assign;
  if (pEVar3 == (Expression *)0x0) {
    scope = (this->super_Symbol).parentScope;
    if ((scope == (Scope *)0x0) ||
       (this_00 = (this->super_Symbol).originatingSyntax, this_00 == (SyntaxNode *)0x0)) {
      assert::assertFailed
                ("scope && syntax",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x1b8,
                 "const Expression &slang::ast::ContinuousAssignSymbol::getAssignment() const");
    }
    LVar4 = LookupLocation::after(&this->super_Symbol);
    lookupLocation._8_8_ = LVar4._8_8_ & 0xffffffff;
    lookupLocation.scope = LVar4.scope;
    ASTContext::ASTContext(&context,scope,lookupLocation,(bitmask<slang::ast::ASTFlags>)0x80);
    pEVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ExpressionSyntax>(this_00);
    iVar1 = Expression::bind((int)pEVar2,(sockaddr *)&context,0x20);
    pEVar3 = (Expression *)CONCAT44(extraout_var,iVar1);
    this->assign = pEVar3;
  }
  return pEVar3;
}

Assistant:

const Expression& ContinuousAssignSymbol::getAssignment() const {
    if (assign)
        return *assign;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    ASSERT(scope && syntax);

    ASTContext context(*scope, LookupLocation::after(*this), ASTFlags::NonProcedural);
    assign = &Expression::bind(syntax->as<ExpressionSyntax>(), context,
                               ASTFlags::AssignmentAllowed);

    return *assign;
}